

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.h
# Opt level: O0

void phaeton::ph_unreachable_internal(char *msg,char *file,uint line)

{
  ostream *poVar1;
  uint line_local;
  char *file_local;
  char *msg_local;
  
  if (msg != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,msg);
    std::operator<<(poVar1,"\n");
  }
  std::operator<<((ostream *)&std::cerr,"UNREACHABLE executed");
  if (file != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr," at ");
    poVar1 = std::operator<<(poVar1,file);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,line);
  }
  std::operator<<((ostream *)&std::cerr,"!\n");
  abort();
}

Assistant:

PH_ATTRIBUTE_NORETURN static void
ph_unreachable_internal(const char *msg = nullptr, const char *file = nullptr,
                        unsigned line = 0) {
  if (msg)
    std::cerr << msg << "\n";
  std::cerr << "UNREACHABLE executed";
  if (file)
    std::cerr << " at " << file << ":" << line;
  std::cerr << "!\n";
  abort();
}